

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O1

string * antlr::operator+(string *__return_storage_ptr__,string *lhs,size_t rhs)

{
  pointer pcVar1;
  char tmp [100];
  char acStack_88 [104];
  
  snprintf(acStack_88,100,"%lu",rhs);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (lhs->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + lhs->_M_string_length);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

string operator+( const ANTLR_USE_NAMESPACE(std)string& lhs, size_t rhs )
{
	char tmp[100];
        snprintf(tmp,100,"%lu",(unsigned long)rhs);
	return lhs+tmp;
}